

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O2

string * __thiscall
MADPComponentDiscreteObservations::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,MADPComponentDiscreteObservations *this)

{
  ostream *poVar1;
  stringstream ss;
  string sStack_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,"MADPComponentDiscreteObservations::Print()");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_198,"#joint observations=");
  GetNrJointObservations(this);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  SoftPrintObservationSets_abi_cxx11_(&sStack_1c8,this);
  std::operator<<(local_198,(string *)&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  poVar1 = std::operator<<(local_198,"Joint Observations:");
  std::endl<char,std::char_traits<char>>(poVar1);
  SoftPrintJointObservationSet_abi_cxx11_(&sStack_1c8,this);
  std::operator<<(local_198,(string *)&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string MADPComponentDiscreteObservations::SoftPrint() const
{
    stringstream ss;
    ss << "MADPComponentDiscreteObservations::Print()" << endl;    
    ss << "#joint observations="<<GetNrJointObservations()<<endl;
    ss << SoftPrintObservationSets();
    ss << "Joint Observations:"<<endl;
    ss << SoftPrintJointObservationSet();    
    return(ss.str());
}